

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Zyx_TestGetTruthTablePars(char *pFileName,word *pTruth,int *nVars,int *nLutSize,int *nNodes)

{
  char cVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  bool bVar4;
  int nLength;
  char *pBuffer;
  char *pCur;
  char Symb;
  int *nNodes_local;
  int *nLutSize_local;
  int *nVars_local;
  word *pTruth_local;
  char *pFileName_local;
  
  __s = Abc_UtilStrsav(pFileName);
  pBuffer = __s;
  while ((*pBuffer != '\0' && (iVar2 = Abc_TtIsHexDigit(*pBuffer), iVar2 != 0))) {
    pBuffer = pBuffer + 1;
  }
  cVar1 = *pBuffer;
  *pBuffer = '\0';
  sVar3 = strlen(__s);
  iVar2 = (int)sVar3;
  if (iVar2 == 1) {
    *nVars = 2;
  }
  else if (iVar2 == 2) {
    *nVars = 3;
  }
  else if (iVar2 == 4) {
    *nVars = 4;
  }
  else if (iVar2 == 8) {
    *nVars = 5;
  }
  else if (iVar2 == 0x10) {
    *nVars = 6;
  }
  else if (iVar2 == 0x20) {
    *nVars = 7;
  }
  else {
    if (iVar2 != 0x40) {
      if (__s != (char *)0x0) {
        free(__s);
      }
      printf("Invalid truth table size.\n");
      return 0;
    }
    *nVars = 8;
  }
  Abc_TtReadHex(pTruth,__s);
  *pBuffer = cVar1;
  do {
    bVar4 = false;
    if (*pBuffer != '\0') {
      bVar4 = *pBuffer != '-';
      pBuffer = pBuffer + 1;
    }
  } while (bVar4);
  if (*pBuffer == '\0') {
    if (__s != (char *)0x0) {
      free(__s);
    }
    printf("Expecting \'-\' after truth table before LUT size.\n");
    pFileName_local._4_4_ = 0;
  }
  else {
    iVar2 = atoi(pBuffer);
    *nLutSize = iVar2;
    do {
      bVar4 = false;
      if (*pBuffer != '\0') {
        bVar4 = *pBuffer != '-';
        pBuffer = pBuffer + 1;
      }
    } while (bVar4);
    if (*pBuffer == '\0') {
      if (__s != (char *)0x0) {
        free(__s);
      }
      printf("Expecting \'-\' after LUT size before node count.\n");
      pFileName_local._4_4_ = 0;
    }
    else {
      iVar2 = atoi(pBuffer);
      *nNodes = iVar2;
      if (__s != (char *)0x0) {
        free(__s);
      }
      pFileName_local._4_4_ = 1;
    }
  }
  return pFileName_local._4_4_;
}

Assistant:

int Zyx_TestGetTruthTablePars( char * pFileName, word * pTruth, int * nVars, int * nLutSize, int * nNodes )
{
    char Symb, * pCur, * pBuffer = Abc_UtilStrsav( pFileName );
    int nLength;
    for ( pCur = pBuffer; *pCur; pCur++ )
        if ( !Abc_TtIsHexDigit(*pCur) )
            break;
    Symb = *pCur; *pCur = 0;
    nLength = (int)strlen(pBuffer);
    if ( nLength == 1 )
        *nVars = 2;
    else if ( nLength == 2 )
        *nVars = 3;
    else if ( nLength == 4 )
        *nVars = 4;
    else if ( nLength == 8 )
        *nVars = 5;
    else if ( nLength == 16 )
        *nVars = 6;
    else if ( nLength == 32 )
        *nVars = 7;
    else if ( nLength == 64 )
        *nVars = 8;
    else
    {
        ABC_FREE( pBuffer );
        printf( "Invalid truth table size.\n" );
        return 0;
    }
    Abc_TtReadHex( pTruth, pBuffer );
    *pCur = Symb;
    // read LUT size
    while ( *pCur && *pCur++ != '-' );
    if ( *pCur == 0 )
    {
        ABC_FREE( pBuffer );
        printf( "Expecting \'-\' after truth table before LUT size.\n" );
        return 0;
    }
    // read node count
    *nLutSize = atoi(pCur);
    while ( *pCur && *pCur++ != '-' );
    if ( *pCur == 0 )
    {
        ABC_FREE( pBuffer );
        printf( "Expecting \'-\' after LUT size before node count.\n" );
        return 0;
    }
    *nNodes = atoi(pCur);
    ABC_FREE( pBuffer );
    return 1;
}